

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O0

int coda_product_variable_set_init_expression
              (coda_product_variable *product_variable,coda_expression *init_expr)

{
  coda_expression *init_expr_local;
  coda_product_variable *product_variable_local;
  
  if (init_expr != (coda_expression *)0x0) {
    if (product_variable->init_expr == (coda_expression *)0x0) {
      product_variable->init_expr = init_expr;
      product_variable_local._4_4_ = 0;
    }
    else {
      coda_set_error(-400,"product variable already has an init expression");
      product_variable_local._4_4_ = -1;
    }
    return product_variable_local._4_4_;
  }
  __assert_fail("init_expr != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition.c"
                ,0x73,
                "int coda_product_variable_set_init_expression(coda_product_variable *, coda_expression *)"
               );
}

Assistant:

int coda_product_variable_set_init_expression(coda_product_variable *product_variable, coda_expression *init_expr)
{
    assert(init_expr != NULL);
    if (product_variable->init_expr != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "product variable already has an init expression");
        return -1;
    }
    product_variable->init_expr = init_expr;
    return 0;
}